

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture3DView *src,float *texCoord,ReferenceParams *params)

{
  Vec3 *w;
  float fVar1;
  int iVar2;
  LodMode mode;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  WrapMode WVar7;
  ulong uVar8;
  int iVar9;
  int x_00;
  ConstPixelBufferAccess *pCVar10;
  int y;
  int x;
  int iVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 extraout_XMM0 [16];
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  Texture3DView TVar35;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Texture3DView src_1;
  Vec4 vq;
  Vec4 uq;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture3DView view;
  Texture3DView src_2;
  Vec4 wq;
  float local_278;
  undefined4 uStack_274;
  float fStack_270;
  float fStack_26c;
  float local_250;
  Vector<float,_4> local_218;
  Vector<float,_4> local_208;
  Vector<float,_4> local_1f8;
  Sampler *local_1e0;
  Vec3 local_1d8;
  Vec3 VStack_1cc;
  Vec3 local_1b8;
  Vec3 VStack_1ac;
  Vec3 local_198;
  Vec3 VStack_18c;
  ulong local_178;
  undefined8 uStack_170;
  undefined1 local_168 [12];
  undefined4 uStack_15c;
  undefined8 local_158;
  undefined1 local_148 [16];
  IVec2 local_138;
  DepthStencilMode DStack_130;
  undefined4 uStack_12c;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_128;
  Vec4 *local_108;
  Vec4 *local_100;
  Texture3DView local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  Vec3 local_b8;
  undefined4 uStack_ac;
  Vec3 local_98;
  deUint32 dStack_8c;
  undefined8 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  undefined4 uStack_6c;
  Vec4 local_60;
  Texture3DView local_50;
  tcu local_40 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  TVar35 = getSubView(src,params->baseLevel,params->maxLevel);
  local_f8.m_levels = TVar35.m_levels;
  local_f8.m_numLevels = TVar35.m_numLevels;
  fVar33 = *texCoord;
  fVar14 = texCoord[3];
  fVar15 = texCoord[6];
  fVar29 = texCoord[9];
  fVar1 = texCoord[1];
  fVar34 = texCoord[4];
  fVar16 = texCoord[7];
  fVar17 = texCoord[10];
  fVar18 = texCoord[2];
  fVar19 = texCoord[5];
  fVar30 = texCoord[8];
  fVar27 = texCoord[0xb];
  local_1e0 = &params->sampler;
  local_218.m_data[0] = fVar18;
  local_218.m_data[1] = fVar19;
  local_218.m_data[2] = fVar30;
  local_218.m_data[3] = fVar27;
  local_208.m_data[0] = fVar1;
  local_208.m_data[1] = fVar34;
  local_208.m_data[2] = fVar16;
  local_208.m_data[3] = fVar17;
  local_1f8.m_data[0] = fVar33;
  local_1f8.m_data[1] = fVar14;
  local_1f8.m_data[2] = fVar15;
  local_1f8.m_data[3] = fVar29;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar35 = tcu::getEffectiveTextureView
                       (&local_f8,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&local_128,local_1e0);
    register0x00000010 = TVar35.m_levels;
    local_168._0_4_ = TVar35.m_numLevels;
    local_178 = 0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_178 = (ulong)(uint)(params->super_RenderParams).bias;
    }
    uStack_170 = 0;
    local_138.m_data[0] = dst->m_width;
    local_138.m_data[1] = dst->m_height;
    if ((int)local_168._0_4_ < 1) {
      local_e8._0_4_ = CLAMP_TO_EDGE;
      local_e8._4_4_ = CLAMP_TO_EDGE;
      local_e8._8_4_ = 0;
    }
    else {
      local_e8._0_4_ = (register0x00000010->m_size).m_data[0];
      local_e8._4_4_ = (register0x00000010->m_size).m_data[1];
      local_e8._8_4_ = (register0x00000010->m_size).m_data[2];
    }
    VStack_18c.m_data[2] = fVar14;
    VStack_18c.m_data[1] = fVar15;
    VStack_1ac.m_data[2] = fVar34;
    VStack_1ac.m_data[1] = fVar16;
    VStack_1cc.m_data[2] = fVar19;
    VStack_1cc.m_data[1] = fVar30;
    local_1d8.m_data[0] = fVar18;
    local_1d8.m_data[1] = fVar19;
    local_1d8.m_data[2] = fVar30;
    VStack_1cc.m_data[0] = fVar27;
    local_1b8.m_data[0] = fVar1;
    local_1b8.m_data[1] = fVar34;
    local_1b8.m_data[2] = fVar16;
    VStack_1ac.m_data[0] = fVar17;
    local_198.m_data[0] = fVar33;
    local_198.m_data[1] = fVar14;
    local_198.m_data[2] = fVar15;
    VStack_18c.m_data[0] = fVar29;
    fVar14 = computeNonProjectedTriLod
                       (params->lodMode,&local_138,(IVec3 *)local_e8,&local_198,&local_1b8,
                        &local_1d8);
    uVar4 = params->minLod;
    uVar5 = params->baseLevel;
    uVar6 = params->maxLevel;
    fVar33 = params->maxLod;
    fVar15 = computeNonProjectedTriLod
                       (params->lodMode,&local_138,(IVec3 *)local_e8,&VStack_18c,&VStack_1ac,
                        &VStack_1cc);
    auVar31._4_4_ = params->maxLod;
    auVar31._0_4_ = fVar33;
    auVar31._8_8_ = 0;
    auVar32._4_4_ = fVar15 + (float)local_178;
    auVar32._0_4_ = fVar14 + (float)local_178;
    auVar32._8_4_ = extraout_XMM0_Db + (float)local_178;
    auVar32._12_4_ = extraout_XMM0_Db_00 + (float)local_178;
    auVar32 = minps(auVar31,auVar32);
    uVar12 = -(uint)(fVar14 + (float)local_178 < (float)uVar4);
    uVar13 = -(uint)(fVar15 + (float)local_178 < params->minLod);
    auVar21._0_8_ = CONCAT44((uint)params->minLod & uVar13,uVar4 & uVar12);
    auVar21._8_4_ = uVar5 & -(uint)(extraout_XMM0_Db + (float)local_178 < (float)uVar5);
    auVar21._12_4_ = uVar6 & -(uint)(extraout_XMM0_Db_00 + (float)local_178 < (float)uVar6);
    local_148._0_8_ = CONCAT44(~uVar13 & auVar32._4_4_,~uVar12 & auVar32._0_4_) | auVar21._0_8_;
    for (iVar9 = 0; iVar9 < dst->m_height; iVar9 = iVar9 + 1) {
      auVar22._4_12_ = auVar21._4_12_;
      auVar22._0_4_ = (float)iVar9 + 0.5;
      auVar32 = auVar22;
      for (iVar11 = 0; iVar11 < dst->m_width; iVar11 = iVar11 + 1) {
        auVar23._4_12_ = auVar32._4_12_;
        auVar23._0_4_ = (float)iVar11 + 0.5;
        uStack_274 = auVar21._4_4_;
        auVar25._12_4_ = auVar32._12_4_;
        auVar25._0_8_ = auVar23._0_8_;
        auVar25._8_4_ = auVar32._4_4_;
        auVar24._8_8_ = auVar25._8_8_;
        auVar24._4_4_ = auVar22._0_4_;
        auVar24._0_4_ = auVar23._0_4_;
        auVar26._0_12_ = auVar24._0_12_;
        auVar26._12_4_ = uStack_274;
        auVar28._0_4_ = (float)dst->m_width;
        auVar28._4_4_ = (float)dst->m_height;
        auVar28._8_8_ = 0;
        auVar32 = divps(auVar26,auVar28);
        fVar33 = auVar32._0_4_;
        fVar14 = auVar32._4_4_;
        bVar3 = 1.0 <= fVar33 + fVar14;
        if (bVar3) {
          fVar33 = 1.0 - fVar33;
          fVar14 = 1.0 - fVar14;
        }
        uVar8 = (ulong)bVar3;
        fVar15 = (&local_198)[uVar8].m_data[0];
        fVar29 = (&local_1b8)[uVar8].m_data[0];
        fVar1 = (&local_1d8)[uVar8].m_data[0];
        tcu::Texture3DView::sample
                  ((Texture3DView *)local_d8,(Sampler *)local_168,
                   ((&local_198)[uVar8].m_data[1] - fVar15) * fVar14 +
                   ((&VStack_18c)[uVar8 - 1].m_data[2] - fVar15) * fVar33 + fVar15,
                   ((&local_1b8)[uVar8].m_data[1] - fVar29) * fVar14 +
                   ((&VStack_1ac)[uVar8 - 1].m_data[2] - fVar29) * fVar33 + fVar29,
                   ((&local_1d8)[uVar8].m_data[1] - fVar1) * fVar14 +
                   ((&VStack_1cc)[uVar8 - 1].m_data[2] - fVar1) * fVar33 + fVar1,
                   *(float *)(local_148 + uVar8 * 4));
        tcu::operator*((tcu *)&local_b8,(Vector<float,_4> *)local_d8,
                       &(params->super_RenderParams).colorScale);
        tcu::operator+((tcu *)&local_98,(Vector<float,_4> *)&local_b8,
                       &(params->super_RenderParams).colorBias);
        tcu::SurfaceAccess::setPixel(dst,(Vec4 *)&local_98,iVar11,iVar9);
        auVar32 = extraout_XMM0;
      }
      auVar21 = auVar32;
    }
  }
  else {
    local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar35 = tcu::getEffectiveTextureView
                       (&local_f8,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&local_128,local_1e0);
    pCVar10 = TVar35.m_levels;
    WVar7 = TVar35.m_numLevels;
    local_e8._0_4_ = WVar7;
    fVar33 = 0.0;
    local_250 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_250 = (params->super_RenderParams).bias;
    }
    if (0 < (int)WVar7) {
      fVar33 = (float)(pCVar10->m_size).m_data[0];
    }
    iVar9 = dst->m_width;
    iVar11 = dst->m_height;
    local_e8._8_8_ = pCVar10;
    tcu::operator*((tcu *)&local_138,fVar33,&local_1f8);
    if ((int)WVar7 < 1) {
      fVar33 = 0.0;
    }
    else {
      fVar33 = (float)(pCVar10->m_size).m_data[1];
    }
    tcu::operator*((tcu *)local_148,fVar33,&local_208);
    if ((int)WVar7 < 1) {
      fVar33 = 0.0;
    }
    else {
      fVar33 = (float)(pCVar10->m_size).m_data[2];
    }
    tcu::operator*((tcu *)&local_78,fVar33,&local_218);
    local_198.m_data[0] = local_1f8.m_data[0];
    local_198.m_data[1] = local_1f8.m_data[1];
    local_198.m_data[2] = local_1f8.m_data[2];
    VStack_18c.m_data[0] = local_1f8.m_data[3];
    VStack_18c.m_data[2] = local_1f8.m_data[1];
    VStack_18c.m_data[1] = local_1f8.m_data[2];
    local_1b8.m_data[0] = local_208.m_data[0];
    local_1b8.m_data[1] = local_208.m_data[1];
    local_1b8.m_data[2] = local_208.m_data[2];
    VStack_1ac.m_data[0] = local_208.m_data[3];
    VStack_1ac.m_data[2] = local_208.m_data[1];
    VStack_1ac.m_data[1] = local_208.m_data[2];
    local_1d8.m_data[0] = local_218.m_data[0];
    local_1d8.m_data[1] = local_218.m_data[1];
    local_1d8.m_data[2] = local_218.m_data[2];
    VStack_1cc.m_data[0] = local_218.m_data[3];
    VStack_1cc.m_data[2] = local_218.m_data[1];
    VStack_1cc.m_data[1] = local_218.m_data[2];
    local_168._0_4_ = local_138.m_data[0];
    local_168._4_4_ = local_138.m_data[1];
    stack0xfffffffffffffea0 = (ConstPixelBufferAccess *)CONCAT44(uStack_12c,DStack_130);
    local_158._4_4_ = (float)local_138.m_data[1];
    local_158._0_4_ = DStack_130;
    local_98.m_data[0] = (float)local_148._0_4_;
    local_98.m_data[1] = (float)local_148._4_4_;
    local_98.m_data[2] = (float)local_148._8_4_;
    dStack_8c = local_148._12_4_;
    local_88 = CONCAT44(local_148._4_4_,local_148._8_4_);
    local_b8.m_data[0] = local_78;
    local_b8.m_data[1] = fStack_74;
    local_b8.m_data[2] = fStack_70;
    uStack_ac = uStack_6c;
    local_d8._0_4_ = (params->super_RenderParams).w.m_data[0];
    local_d8._4_4_ = (params->super_RenderParams).w.m_data[1];
    fStack_d0 = (params->super_RenderParams).w.m_data[2];
    fStack_cc = (params->super_RenderParams).w.m_data[3];
    local_c8._4_4_ = (float)local_d8._4_4_;
    local_c8._0_4_ = (int)fStack_d0;
    local_100 = &(params->super_RenderParams).colorScale;
    local_108 = &(params->super_RenderParams).colorBias;
    for (y = 0; y < dst->m_height; y = y + 1) {
      fVar33 = (float)y + 0.5;
      fVar14 = fVar33 / (float)iVar11;
      for (x_00 = 0; iVar2 = dst->m_width, x_00 < iVar2; x_00 = x_00 + 1) {
        fVar29 = (float)x_00 + 0.5;
        fVar34 = fVar29 / (float)iVar9;
        bVar3 = 1.0 <= fVar14 + fVar34;
        fVar15 = fVar14;
        fVar1 = fVar33;
        if (bVar3) {
          fVar29 = (float)iVar9 - fVar29;
          fVar34 = 1.0 - fVar34;
          fVar15 = 1.0 - fVar14;
          fVar1 = (float)iVar11 - fVar33;
        }
        uVar8 = (ulong)bVar3;
        w = (Vec3 *)(local_d8 + uVar8 * 0xc);
        fVar16 = projectedTriInterpolate(&local_198 + uVar8,w,fVar34,fVar15);
        fVar17 = projectedTriInterpolate(&local_1b8 + uVar8,w,fVar34,fVar15);
        fVar15 = projectedTriInterpolate(&local_1d8 + uVar8,w,fVar34,fVar15);
        mode = params->lodMode;
        fVar27 = (float)iVar2;
        fVar34 = (float)dst->m_height;
        fVar30 = fVar1 / fVar34;
        fVar18 = triDerivateX((Vec3 *)(local_168 + uVar8 * 0xc),w,fVar29,fVar27,fVar30);
        fVar19 = triDerivateX(&local_98 + uVar8,w,fVar29,fVar27,fVar30);
        fVar30 = triDerivateX(&local_b8 + uVar8,w,fVar29,fVar27,fVar30);
        fVar29 = fVar29 / fVar27;
        fVar27 = triDerivateY((Vec3 *)(local_168 + uVar8 * 0xc),w,fVar1,fVar34,fVar29);
        fVar20 = triDerivateY(&local_98 + uVar8,w,fVar1,fVar34,fVar29);
        local_178 = CONCAT44(local_178._4_4_,fVar20);
        fVar29 = triDerivateY(&local_b8 + uVar8,w,fVar1,fVar34,fVar29);
        fVar29 = computeLodFromDerivates(mode,fVar18,fVar19,fVar30,fVar27,(float)local_178,fVar29);
        tcu::Texture3DView::sample
                  (&local_50,(Sampler *)local_e8,fVar16,fVar17,fVar15,fVar29 + local_250);
        tcu::operator*(local_40,(Vector<float,_4> *)&local_50,local_100);
        tcu::operator+((tcu *)&local_60,(Vector<float,_4> *)local_40,local_108);
        tcu::SurfaceAccess::setPixel(dst,&local_60,x_00,y);
      }
    }
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_128);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture3DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture3DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, rq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, rq, params);
}